

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O3

int Am_Height_Of_Parts_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object comp;
  Am_Value_List components;
  Am_Object local_40;
  Am_Value_List local_38;
  
  Am_Value_List::Am_Value_List(&local_38);
  local_40.data = (Am_Object_Data *)0x0;
  pAVar5 = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=(&local_38,pAVar5);
  Am_Value_List::Start(&local_38);
  iVar4 = 0;
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_38);
    if (bVar1) break;
    pAVar5 = Am_Value_List::Get(&local_38);
    Am_Object::operator=(&local_40,pAVar5);
    pAVar5 = Am_Object::Get(&local_40,0x69,0);
    bVar1 = Am_Value::Valid(pAVar5);
    if (bVar1) {
      pAVar5 = Am_Object::Get(&local_40,0x65,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = Am_Object::Get(&local_40,0x67,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar4 <= iVar3 + iVar2) {
        iVar4 = iVar3 + iVar2;
      }
    }
    Am_Value_List::Next(&local_38);
  }
  pAVar5 = Am_Object::Get(self,0xa1,5);
  bVar1 = Am_Value::Exists(pAVar5);
  if (bVar1) {
    pAVar5 = Am_Object::Get(self,0xa1,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    iVar4 = iVar2 + iVar4;
  }
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List(&local_38);
  return iVar4;
}

Assistant:

Am_Define_Formula(int, Am_Height_Of_Parts)
{
  int max_y = 0, comp_bottom;
  Am_Value_List components;
  Am_Object comp;
  components = self.Get(Am_GRAPHICAL_PARTS);
  for (components.Start(); !components.Last(); components.Next()) {
    comp = components.Get();
    if (comp.Get(Am_VISIBLE).Valid()) {
      // compute how much of the component extends below the origin
      comp_bottom = ((int)(comp.Get(Am_TOP)) + (int)(comp.Get(Am_HEIGHT)));
      max_y = imax(max_y, comp_bottom);
    }
  }
  if (self.Peek(Am_BOTTOM_OFFSET, Am_NO_DEPENDENCY).Exists())
    max_y += (int)self.Get(Am_BOTTOM_OFFSET);
  return max_y; // always >=0 since it's initialized to 0
}